

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O0

void __thiscall embree::OBJLoader::loadMTL(OBJLoader *this,FileName *fileName)

{
  undefined8 uVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined1 *puVar6;
  ulong uVar7;
  OBJLoader *this_00;
  size_t sVar8;
  mapped_type *pmVar9;
  runtime_error *this_01;
  fd_set *in_RCX;
  fd_set *__readfds;
  fd_set *__readfds_00;
  fd_set *in_R8;
  timeval *in_R9;
  bool bVar10;
  runtime_error *e;
  string type;
  char *token;
  string next_line;
  string line;
  ExtObjMaterial cur;
  string name;
  ifstream cin;
  ExtObjMaterial *in_stack_fffffffffffff238;
  ExtObjMaterial *in_stack_fffffffffffff240;
  char **in_stack_fffffffffffff250;
  char **in_stack_fffffffffffff258;
  ExtObjMaterial *in_stack_fffffffffffff278;
  undefined4 in_stack_fffffffffffff280;
  float in_stack_fffffffffffff284;
  float in_stack_fffffffffffff288;
  float in_stack_fffffffffffff28c;
  float in_stack_fffffffffffff290;
  float in_stack_fffffffffffff294;
  FileName *fname;
  undefined1 local_c70 [28];
  undefined1 local_c54 [132];
  element_type *peStack_bd0;
  undefined1 local_bc4 [8];
  uint local_bbc;
  undefined1 local_bb8 [112];
  float local_b48;
  float local_b44;
  float local_b40;
  float local_b3c;
  undefined1 local_b38 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b10;
  undefined1 local_a74 [8];
  uint local_a6c;
  undefined1 local_a68 [32];
  string local_a48 [36];
  undefined4 local_a24;
  undefined4 local_a20;
  uint local_a1c;
  undefined1 local_a18 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_9f0;
  undefined1 local_9e4 [8];
  uint local_9dc;
  undefined1 local_9d8 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_9b0;
  undefined1 local_9a4 [8];
  uint local_99c;
  fd_set local_998 [3];
  undefined1 local_808 [288];
  undefined1 local_6e8 [16];
  string local_6d8 [32];
  FileName local_6b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_698;
  float local_688;
  undefined1 local_678 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_670;
  undefined1 local_668 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_660;
  undefined1 local_658 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_650;
  element_type *local_648;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_640;
  float local_5c8;
  float local_5b0;
  float local_5ac;
  float local_598;
  undefined1 local_594 [12];
  undefined1 local_588 [16];
  string local_578 [36];
  int local_554;
  string local_550 [48];
  istream local_520 [536];
  undefined1 *local_308;
  fd_set *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  undefined4 *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  float *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  undefined1 *local_258;
  undefined8 *local_248;
  mapped_type *local_240;
  long *local_238;
  mapped_type *local_230;
  mapped_type *local_228;
  mapped_type *local_220;
  fd_set *local_218;
  undefined1 *local_210;
  fd_set *local_208;
  undefined1 *local_200;
  fd_set *local_1f8;
  element_type **local_1f0;
  fd_set *local_1e8;
  element_type **local_1e0;
  fd_set *local_1d8;
  undefined1 *local_1d0;
  fd_set *local_1c8;
  element_type **local_1c0;
  fd_set *local_1b8;
  element_type **local_1b0;
  fd_set *local_1a8;
  undefined1 *local_1a0;
  fd_set *local_198;
  undefined1 *local_190;
  fd_set *local_188;
  undefined1 *local_180;
  float *local_178;
  float *local_170;
  fd_set *local_168;
  undefined1 *local_160;
  fd_set *local_158;
  undefined1 *local_150;
  element_type *peStack_140;
  undefined4 local_12c;
  element_type *peStack_120;
  undefined4 local_10c;
  element_type *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  float local_f8;
  float local_f4;
  float local_f0;
  undefined4 local_ec;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  undefined4 local_cc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  undefined4 local_ac;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  undefined4 local_8c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  undefined4 local_6c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  undefined4 local_4c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  undefined4 local_2c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  undefined4 local_4;
  
  std::ifstream::ifstream(local_520);
  pcVar4 = FileName::c_str((FileName *)0x4a22f1);
  std::ifstream::open((char *)local_520,(_Ios_Openmode)pcVar4);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"cannot open ");
    FileName::str_abi_cxx11_((FileName *)in_stack_fffffffffffff238);
    poVar5 = std::operator<<(poVar5,local_550);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_550);
    local_554 = 1;
  }
  else {
    std::__cxx11::string::string(local_578);
    ExtObjMaterial::ExtObjMaterial(in_stack_fffffffffffff278);
    while (iVar3 = std::istream::peek(), iVar3 != -1) {
      std::__cxx11::string::string((string *)&local_6b8);
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_520,(string *)&local_6b8)
      ;
      do {
        bVar2 = std::__cxx11::string::empty();
        in_RCX = (fd_set *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar2);
        bVar10 = false;
        if ((bVar2 & 1) == 0) {
          std::__cxx11::string::size();
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&local_6b8);
          bVar10 = *pcVar4 == '\\';
        }
        if (!bVar10) break;
        std::__cxx11::string::size();
        puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&local_6b8);
        *puVar6 = 0x20;
        std::__cxx11::string::string(local_6d8);
        std::getline<char,std::char_traits<char>,std::allocator<char>>(local_520,local_6d8);
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)&local_6b8,local_6d8);
          local_554 = 0;
        }
        else {
          local_554 = 5;
        }
        std::__cxx11::string::~string(local_6d8);
      } while (local_554 == 0);
      fname = &local_6b8;
      this_00 = (OBJLoader *)std::__cxx11::string::c_str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      sVar8 = strspn(pcVar4," \t");
      local_6e8._8_8_ = trimEnd((char *)((long)&(this_00->group).ptr + sVar8));
      if (*(char *)local_6e8._8_8_ == '\0') {
        local_554 = 2;
      }
      else if (*(char *)local_6e8._8_8_ == '#') {
        local_554 = 2;
      }
      else {
        iVar3 = strncmp((char *)local_6e8._8_8_,"newmtl",6);
        if (iVar3 == 0) {
          bVar10 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff240,(char *)in_stack_fffffffffffff238);
          if (bVar10) {
            ExtObjMaterial::select
                      ((ExtObjMaterial *)local_6e8,(int)&local_698,__readfds,in_RCX,in_R8,in_R9);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
                                  (key_type *)in_stack_fffffffffffff278);
            local_238 = (long *)local_6e8;
            local_230 = pmVar9;
            if (pmVar9->ptr != (MaterialNode *)0x0) {
              (*(pmVar9->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
            }
            in_RCX = (fd_set *)*local_238;
            pmVar9->ptr = (MaterialNode *)in_RCX;
            *local_238 = 0;
            local_268 = local_6e8;
            if ((long *)local_6e8._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_6e8._0_8_ + 0x18))();
            }
            local_220 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                                      *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280
                                                ),(key_type *)in_stack_fffffffffffff278);
            std::__cxx11::string::operator=((string *)&(local_220->ptr->super_Node).name,local_578);
          }
          local_6e8._8_8_ = local_6e8._8_8_ + 6;
          parseSep(in_stack_fffffffffffff250);
          std::__cxx11::string::operator=(local_578,(char *)local_6e8._8_8_);
          memset(local_808,0,0x120);
          ExtObjMaterial::ExtObjMaterial(in_stack_fffffffffffff278);
          ExtObjMaterial::operator=(in_stack_fffffffffffff240,in_stack_fffffffffffff238);
          ExtObjMaterial::~ExtObjMaterial(in_stack_fffffffffffff240);
          local_554 = 2;
        }
        else {
          bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff240,(char *)in_stack_fffffffffffff238);
          if (bVar10) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this_01,"invalid material file: newmtl expected first");
            __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar3 = strncmp((char *)local_6e8._8_8_,"illum",5);
          if (iVar3 == 0) {
            local_6e8._8_8_ = local_6e8._8_8_ + 5;
            parseSep(in_stack_fffffffffffff250);
            local_554 = 2;
          }
          else {
            iVar3 = strncmp((char *)local_6e8._8_8_,"d",1);
            if (iVar3 == 0) {
              local_6e8._8_8_ = local_6e8._8_8_ + 1;
              parseSep(in_stack_fffffffffffff250);
              local_698.m128[2] = getFloat((char **)in_stack_fffffffffffff240);
              local_554 = 2;
            }
            else {
              iVar3 = strncmp((char *)local_6e8._8_8_,"Ns",2);
              if (iVar3 == 0) {
                local_6e8._8_8_ = local_6e8._8_8_ + 2;
                parseSep(in_stack_fffffffffffff250);
                local_698.m128[3] = getFloat((char **)in_stack_fffffffffffff240);
                local_554 = 2;
              }
              else {
                iVar3 = strncmp((char *)local_6e8._8_8_,"Ni",2);
                if (iVar3 == 0) {
                  local_6e8._8_8_ = local_6e8._8_8_ + 2;
                  parseSep(in_stack_fffffffffffff250);
                  local_688 = getFloat((char **)in_stack_fffffffffffff240);
                  local_554 = 2;
                }
                else {
                  iVar3 = strncmp((char *)local_6e8._8_8_,"map_d",5);
                  if ((iVar3 == 0) ||
                     (iVar3 = strncmp((char *)local_6e8._8_8_,"d_map",5), iVar3 == 0)) {
                    local_6e8._8_8_ = local_6e8._8_8_ + 5;
                    parseSep(in_stack_fffffffffffff250);
                    FileName::FileName((FileName *)
                                       CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290)
                                       ,(char *)CONCAT44(in_stack_fffffffffffff28c,
                                                         in_stack_fffffffffffff288));
                    loadTexture(this_00,fname);
                    std::shared_ptr<embree::Texture>::operator=
                              ((shared_ptr<embree::Texture> *)in_stack_fffffffffffff240,
                               (shared_ptr<embree::Texture> *)in_stack_fffffffffffff238);
                    std::shared_ptr<embree::Texture>::~shared_ptr
                              ((shared_ptr<embree::Texture> *)0x4a2cc4);
                    FileName::~FileName((FileName *)0x4a2cd1);
                    local_554 = 2;
                  }
                  else {
                    iVar3 = strncmp((char *)local_6e8._8_8_,"map_Ka",6);
                    if ((iVar3 == 0) ||
                       (iVar3 = strncmp((char *)local_6e8._8_8_,"Ka_map",6), iVar3 == 0)) {
                      local_6e8._8_8_ = local_6e8._8_8_ + 6;
                      parseSep(in_stack_fffffffffffff250);
                      FileName::FileName((FileName *)
                                         CONCAT44(in_stack_fffffffffffff294,
                                                  in_stack_fffffffffffff290),
                                         (char *)CONCAT44(in_stack_fffffffffffff28c,
                                                          in_stack_fffffffffffff288));
                      loadTexture(this_00,fname);
                      std::shared_ptr<embree::Texture>::operator=
                                ((shared_ptr<embree::Texture> *)in_stack_fffffffffffff240,
                                 (shared_ptr<embree::Texture> *)in_stack_fffffffffffff238);
                      std::shared_ptr<embree::Texture>::~shared_ptr
                                ((shared_ptr<embree::Texture> *)0x4a2dc6);
                      FileName::~FileName((FileName *)0x4a2dd3);
                      local_554 = 2;
                    }
                    else {
                      iVar3 = strncmp((char *)local_6e8._8_8_,"map_Kd",6);
                      if ((iVar3 == 0) ||
                         (iVar3 = strncmp((char *)local_6e8._8_8_,"Kd_map",6), iVar3 == 0)) {
                        local_6e8._8_8_ = local_6e8._8_8_ + 6;
                        parseSep(in_stack_fffffffffffff250);
                        FileName::FileName((FileName *)
                                           CONCAT44(in_stack_fffffffffffff294,
                                                    in_stack_fffffffffffff290),
                                           (char *)CONCAT44(in_stack_fffffffffffff28c,
                                                            in_stack_fffffffffffff288));
                        loadTexture(this_00,fname);
                        std::shared_ptr<embree::Texture>::operator=
                                  ((shared_ptr<embree::Texture> *)in_stack_fffffffffffff240,
                                   (shared_ptr<embree::Texture> *)in_stack_fffffffffffff238);
                        std::shared_ptr<embree::Texture>::~shared_ptr
                                  ((shared_ptr<embree::Texture> *)0x4a2ecb);
                        FileName::~FileName((FileName *)0x4a2ed8);
                        local_554 = 2;
                      }
                      else {
                        iVar3 = strncmp((char *)local_6e8._8_8_,"map_Ks",6);
                        if ((iVar3 == 0) ||
                           (iVar3 = strncmp((char *)local_6e8._8_8_,"Ks_map",6), iVar3 == 0)) {
                          local_6e8._8_8_ = local_6e8._8_8_ + 6;
                          parseSep(in_stack_fffffffffffff250);
                          FileName::FileName((FileName *)
                                             CONCAT44(in_stack_fffffffffffff294,
                                                      in_stack_fffffffffffff290),
                                             (char *)CONCAT44(in_stack_fffffffffffff28c,
                                                              in_stack_fffffffffffff288));
                          loadTexture(this_00,fname);
                          std::shared_ptr<embree::Texture>::operator=
                                    ((shared_ptr<embree::Texture> *)in_stack_fffffffffffff240,
                                     (shared_ptr<embree::Texture> *)in_stack_fffffffffffff238);
                          std::shared_ptr<embree::Texture>::~shared_ptr
                                    ((shared_ptr<embree::Texture> *)0x4a2fd0);
                          FileName::~FileName((FileName *)0x4a2fdd);
                          local_554 = 2;
                        }
                        else {
                          iVar3 = strncmp((char *)local_6e8._8_8_,"map_Kt",6);
                          if ((iVar3 == 0) ||
                             (iVar3 = strncmp((char *)local_6e8._8_8_,"Kt_map",6), iVar3 == 0)) {
                            local_6e8._8_8_ = local_6e8._8_8_ + 6;
                            parseSep(in_stack_fffffffffffff250);
                            FileName::FileName((FileName *)
                                               CONCAT44(in_stack_fffffffffffff294,
                                                        in_stack_fffffffffffff290),
                                               (char *)CONCAT44(in_stack_fffffffffffff28c,
                                                                in_stack_fffffffffffff288));
                            loadTexture(this_00,fname);
                            std::shared_ptr<embree::Texture>::operator=
                                      ((shared_ptr<embree::Texture> *)in_stack_fffffffffffff240,
                                       (shared_ptr<embree::Texture> *)in_stack_fffffffffffff238);
                            std::shared_ptr<embree::Texture>::~shared_ptr
                                      ((shared_ptr<embree::Texture> *)0x4a30d5);
                            FileName::~FileName((FileName *)0x4a30e2);
                            local_554 = 2;
                          }
                          else {
                            iVar3 = strncmp((char *)local_6e8._8_8_,"map_Tf",6);
                            if ((iVar3 == 0) ||
                               (iVar3 = strncmp((char *)local_6e8._8_8_,"Tf_map",6), iVar3 == 0)) {
                              local_6e8._8_8_ = local_6e8._8_8_ + 6;
                              parseSep(in_stack_fffffffffffff250);
                              FileName::FileName((FileName *)
                                                 CONCAT44(in_stack_fffffffffffff294,
                                                          in_stack_fffffffffffff290),
                                                 (char *)CONCAT44(in_stack_fffffffffffff28c,
                                                                  in_stack_fffffffffffff288));
                              loadTexture(this_00,fname);
                              std::shared_ptr<embree::Texture>::operator=
                                        ((shared_ptr<embree::Texture> *)in_stack_fffffffffffff240,
                                         (shared_ptr<embree::Texture> *)in_stack_fffffffffffff238);
                              std::shared_ptr<embree::Texture>::~shared_ptr
                                        ((shared_ptr<embree::Texture> *)0x4a31da);
                              FileName::~FileName((FileName *)0x4a31e7);
                              local_554 = 2;
                            }
                            else {
                              iVar3 = strncmp((char *)local_6e8._8_8_,"map_Ns",6);
                              if ((iVar3 == 0) ||
                                 (iVar3 = strncmp((char *)local_6e8._8_8_,"Ns_map",6), iVar3 == 0))
                              {
                                local_6e8._8_8_ = local_6e8._8_8_ + 6;
                                parseSep(in_stack_fffffffffffff250);
                                FileName::FileName((FileName *)
                                                   CONCAT44(in_stack_fffffffffffff294,
                                                            in_stack_fffffffffffff290),
                                                   (char *)CONCAT44(in_stack_fffffffffffff28c,
                                                                    in_stack_fffffffffffff288));
                                loadTexture(this_00,fname);
                                std::shared_ptr<embree::Texture>::operator=
                                          ((shared_ptr<embree::Texture> *)in_stack_fffffffffffff240,
                                           (shared_ptr<embree::Texture> *)in_stack_fffffffffffff238)
                                ;
                                std::shared_ptr<embree::Texture>::~shared_ptr
                                          ((shared_ptr<embree::Texture> *)0x4a32df);
                                FileName::~FileName((FileName *)0x4a32ec);
                                local_554 = 2;
                              }
                              else {
                                iVar3 = strncmp((char *)local_6e8._8_8_,"map_Displ",9);
                                if ((iVar3 == 0) ||
                                   (iVar3 = strncmp((char *)local_6e8._8_8_,"Displ_map",9),
                                   iVar3 == 0)) {
                                  local_6e8._8_8_ = local_6e8._8_8_ + 9;
                                  parseSep(in_stack_fffffffffffff250);
                                  FileName::FileName((FileName *)
                                                     CONCAT44(in_stack_fffffffffffff294,
                                                              in_stack_fffffffffffff290),
                                                     (char *)CONCAT44(in_stack_fffffffffffff28c,
                                                                      in_stack_fffffffffffff288));
                                  loadTexture(this_00,fname);
                                  std::shared_ptr<embree::Texture>::operator=
                                            ((shared_ptr<embree::Texture> *)
                                             in_stack_fffffffffffff240,
                                             (shared_ptr<embree::Texture> *)
                                             in_stack_fffffffffffff238);
                                  std::shared_ptr<embree::Texture>::~shared_ptr
                                            ((shared_ptr<embree::Texture> *)0x4a33e4);
                                  FileName::~FileName((FileName *)0x4a33f1);
                                  local_554 = 2;
                                }
                                else {
                                  iVar3 = strncmp((char *)local_6e8._8_8_,"Ka",2);
                                  if (iVar3 == 0) {
                                    local_6e8._8_8_ = local_6e8._8_8_ + 2;
                                    parseSep(in_stack_fffffffffffff250);
                                    getVec3f(in_stack_fffffffffffff258);
                                    local_300 = local_998;
                                    local_308 = local_9a4;
                                    local_4 = 0;
                                    p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                 (ulong)local_99c;
                                    local_180 = local_678;
                                    in_RCX = local_998;
                                    local_554 = 2;
                                    local_188 = in_RCX;
                                    local_998[0].fds_bits[1] = (__fd_mask)p_Stack_20;
                                    _Stack_670._M_pi = p_Stack_20;
                                  }
                                  else {
                                    iVar3 = strncmp((char *)local_6e8._8_8_,"Kd",2);
                                    if (iVar3 == 0) {
                                      local_6e8._8_8_ = local_6e8._8_8_ + 2;
                                      parseSep(in_stack_fffffffffffff250);
                                      getVec3f(in_stack_fffffffffffff258);
                                      local_2f0 = local_9d8 + 0x20;
                                      local_2f8 = local_9d8 + 0x14;
                                      local_2c = 0;
                                      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                   (ulong)(uint)local_9d8._28_4_;
                                      local_190 = local_668;
                                      in_RCX = (fd_set *)(local_9d8 + 0x20);
                                      local_554 = 2;
                                      local_198 = in_RCX;
                                      p_Stack_9b0 = p_Stack_40;
                                      _Stack_660._M_pi = p_Stack_40;
                                    }
                                    else {
                                      iVar3 = strncmp((char *)local_6e8._8_8_,"Ks",2);
                                      if (iVar3 == 0) {
                                        local_6e8._8_8_ = local_6e8._8_8_ + 2;
                                        parseSep(in_stack_fffffffffffff250);
                                        getVec3f(in_stack_fffffffffffff258);
                                        local_2e0 = local_9d8;
                                        local_2e8 = local_9e4;
                                        local_4c = 0;
                                        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *
                                                     )(ulong)local_9dc;
                                        local_1a0 = local_658;
                                        in_RCX = (fd_set *)local_9d8;
                                        local_554 = 2;
                                        local_1a8 = in_RCX;
                                        local_9d8._8_8_ = p_Stack_60;
                                        _Stack_650._M_pi = p_Stack_60;
                                      }
                                      else {
                                        iVar3 = strncmp((char *)local_6e8._8_8_,"Kt",2);
                                        if (iVar3 == 0) {
                                          local_6e8._8_8_ = local_6e8._8_8_ + 2;
                                          parseSep(in_stack_fffffffffffff250);
                                          getVec3f(in_stack_fffffffffffff258);
                                          local_2d0 = local_a18 + 0x20;
                                          local_2d8 = local_a18 + 0x14;
                                          local_648 = (element_type *)
                                                      CONCAT44(local_a18._24_4_,local_a18._20_4_);
                                          local_6c = 0;
                                          p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                        *)(ulong)(uint)local_a18._28_4_;
                                          local_1b0 = &local_648;
                                          in_RCX = (fd_set *)(local_a18 + 0x20);
                                          local_554 = 2;
                                          local_1b8 = in_RCX;
                                          p_Stack_9f0 = p_Stack_80;
                                          _Stack_640._M_pi = p_Stack_80;
                                        }
                                        else {
                                          iVar3 = strncmp((char *)local_6e8._8_8_,"Tf",2);
                                          if (iVar3 == 0) {
                                            local_6e8._8_8_ = local_6e8._8_8_ + 2;
                                            parseSep(in_stack_fffffffffffff250);
                                            getVec3f(in_stack_fffffffffffff258);
                                            local_2c0 = local_a18;
                                            local_2c8 = &local_a24;
                                            local_648 = (element_type *)
                                                        CONCAT44(local_a20,local_a24);
                                            local_8c = 0;
                                            p_Stack_a0 = (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  (ulong)local_a1c;
                                            local_1c0 = &local_648;
                                            in_RCX = (fd_set *)local_a18;
                                            local_554 = 2;
                                            local_1c8 = in_RCX;
                                            local_a18._8_8_ = p_Stack_a0;
                                            _Stack_640._M_pi = p_Stack_a0;
                                          }
                                          else {
                                            iVar3 = strncmp((char *)local_6e8._8_8_,"type",4);
                                            if (iVar3 == 0) {
                                              local_6e8._8_8_ = local_6e8._8_8_ + 4;
                                              parseSep(in_stack_fffffffffffff250);
                                              uVar1 = local_6e8._8_8_;
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string
                                                        (local_a48,(char *)uVar1,
                                                         (allocator *)(local_a68 + 0x1f));
                                              std::allocator<char>::~allocator
                                                        ((allocator<char> *)(local_a68 + 0x1f));
                                              bVar10 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff240,
                                                  (char *)in_stack_fffffffffffff238);
                                              if (bVar10) {
                                                local_698.m128[0] = 1.4013e-45;
                                              }
                                              else {
                                                bVar10 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff240,
                                                  (char *)in_stack_fffffffffffff238);
                                                if (bVar10) {
                                                  local_698.m128[0] = 2.8026e-45;
                                                }
                                                else {
                                                  bVar10 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff240,
                                                  (char *)in_stack_fffffffffffff238);
                                                  if (bVar10) {
                                                    local_698.m128[0] = 4.2039e-45;
                                                  }
                                                  else {
                                                    bVar10 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff240,
                                                  (char *)in_stack_fffffffffffff238);
                                                  if (bVar10) {
                                                    local_698.m128[0] = 5.60519e-45;
                                                  }
                                                  else {
                                                    bVar10 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff240,
                                                  (char *)in_stack_fffffffffffff238);
                                                  if (bVar10) {
                                                    local_698.m128[0] = 0.0;
                                                  }
                                                  else {
                                                    bVar10 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff240,
                                                  (char *)in_stack_fffffffffffff238);
                                                  if (bVar10) {
                                                    local_698.m128[0] = 0.0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                              local_554 = 2;
                                              std::__cxx11::string::~string(local_a48);
                                            }
                                            else {
                                              iVar3 = strncmp((char *)local_6e8._8_8_,"baseColor",9)
                                              ;
                                              if (iVar3 == 0) {
                                                local_6e8._8_8_ = local_6e8._8_8_ + 9;
                                                parseSep(in_stack_fffffffffffff250);
                                                getVec3f(in_stack_fffffffffffff258);
                                                local_2b0 = local_a68;
                                                local_2b8 = local_a74;
                                                local_ac = 0;
                                                p_Stack_c0 = (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  (ulong)local_a6c;
                                                local_1d0 = local_668;
                                                in_RCX = (fd_set *)local_a68;
                                                local_554 = 2;
                                                local_1d8 = in_RCX;
                                                local_a68._8_8_ = p_Stack_c0;
                                                _Stack_660._M_pi = p_Stack_c0;
                                              }
                                              else {
                                                iVar3 = strncmp((char *)local_6e8._8_8_,"ior",3);
                                                if (iVar3 == 0) {
                                                  local_6e8._8_8_ = local_6e8._8_8_ + 3;
                                                  parseSep(in_stack_fffffffffffff250);
                                                  in_stack_fffffffffffff294 =
                                                       getFloat((char **)in_stack_fffffffffffff240);
                                                  local_554 = 2;
                                                  local_688 = in_stack_fffffffffffff294;
                                                }
                                                else {
                                                  iVar3 = strncmp((char *)local_6e8._8_8_,
                                                                  "map_baseColor",0xd);
                                                  if (iVar3 == 0) {
                                                    local_6e8._8_8_ = local_6e8._8_8_ + 0xd;
                                                    parseSep(in_stack_fffffffffffff250);
                                                    FileName::FileName((FileName *)
                                                                       CONCAT44(
                                                  in_stack_fffffffffffff294,
                                                  in_stack_fffffffffffff290),
                                                  (char *)CONCAT44(in_stack_fffffffffffff28c,
                                                                   in_stack_fffffffffffff288));
                                                  loadTexture(this_00,fname);
                                                  std::shared_ptr<embree::Texture>::operator=
                                                            ((shared_ptr<embree::Texture> *)
                                                             in_stack_fffffffffffff240,
                                                             (shared_ptr<embree::Texture> *)
                                                             in_stack_fffffffffffff238);
                                                  std::shared_ptr<embree::Texture>::~shared_ptr
                                                            ((shared_ptr<embree::Texture> *)0x4a3f2c
                                                            );
                                                  FileName::~FileName((FileName *)0x4a3f39);
                                                  local_554 = 2;
                                                  }
                                                  else {
                                                    iVar3 = strncmp((char *)local_6e8._8_8_,
                                                                    "map_specular",0xc);
                                                    if (iVar3 == 0) {
                                                      local_6e8._8_8_ = local_6e8._8_8_ + 0xc;
                                                      parseSep(in_stack_fffffffffffff250);
                                                      FileName::FileName((FileName *)
                                                                         CONCAT44(
                                                  in_stack_fffffffffffff294,
                                                  in_stack_fffffffffffff290),
                                                  (char *)CONCAT44(in_stack_fffffffffffff28c,
                                                                   in_stack_fffffffffffff288));
                                                  loadTexture(this_00,fname);
                                                  std::shared_ptr<embree::Texture>::operator=
                                                            ((shared_ptr<embree::Texture> *)
                                                             in_stack_fffffffffffff240,
                                                             (shared_ptr<embree::Texture> *)
                                                             in_stack_fffffffffffff238);
                                                  std::shared_ptr<embree::Texture>::~shared_ptr
                                                            ((shared_ptr<embree::Texture> *)0x4a4013
                                                            );
                                                  FileName::~FileName((FileName *)0x4a4020);
                                                  local_554 = 2;
                                                  }
                                                  else {
                                                    iVar3 = strncmp((char *)local_6e8._8_8_,
                                                                    "map_normal.scale",0x10);
                                                    if (iVar3 == 0) {
                                                      local_6e8._8_8_ = local_6e8._8_8_ + 0x10;
                                                      parseSep(in_stack_fffffffffffff250);
                                                      local_554 = 2;
                                                    }
                                                    else {
                                                      iVar3 = strncmp((char *)local_6e8._8_8_,
                                                                      "map_normal",10);
                                                      if (iVar3 == 0) {
                                                        local_6e8._8_8_ = local_6e8._8_8_ + 10;
                                                        parseSep(in_stack_fffffffffffff250);
                                                        FileName::FileName((FileName *)
                                                                           CONCAT44(
                                                  in_stack_fffffffffffff294,
                                                  in_stack_fffffffffffff290),
                                                  (char *)CONCAT44(in_stack_fffffffffffff28c,
                                                                   in_stack_fffffffffffff288));
                                                  loadTexture(this_00,fname);
                                                  std::shared_ptr<embree::Texture>::operator=
                                                            ((shared_ptr<embree::Texture> *)
                                                             in_stack_fffffffffffff240,
                                                             (shared_ptr<embree::Texture> *)
                                                             in_stack_fffffffffffff238);
                                                  std::shared_ptr<embree::Texture>::~shared_ptr
                                                            ((shared_ptr<embree::Texture> *)0x4a414b
                                                            );
                                                  FileName::~FileName((FileName *)0x4a4158);
                                                  local_554 = 2;
                                                  }
                                                  else {
                                                    iVar3 = strncmp((char *)local_6e8._8_8_,
                                                                    "transmissionColor",0x11);
                                                    if (iVar3 == 0) {
                                                      local_6e8._8_8_ = local_6e8._8_8_ + 0x11;
                                                      parseSep(in_stack_fffffffffffff250);
                                                      getVec3f(in_stack_fffffffffffff258);
                                                      local_2a0 = local_b38 + 0x20;
                                                      local_2a8 = local_b38 + 0x14;
                                                      local_648 = (element_type *)
                                                                  CONCAT44(local_b38._24_4_,
                                                                           local_b38._20_4_);
                                                      local_cc = 0;
                                                      p_Stack_e0 = (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  (ulong)(uint)local_b38._28_4_;
                                                  local_1e0 = &local_648;
                                                  in_RCX = (fd_set *)(local_b38 + 0x20);
                                                  local_554 = 2;
                                                  local_1e8 = in_RCX;
                                                  p_Stack_b10 = p_Stack_e0;
                                                  _Stack_640._M_pi = p_Stack_e0;
                                                  }
                                                  else {
                                                    iVar3 = strncmp((char *)local_6e8._8_8_,
                                                                    "transmission",0xc);
                                                    if (iVar3 == 0) {
                                                      local_6e8._8_8_ = local_6e8._8_8_ + 0xc;
                                                      parseSep(in_stack_fffffffffffff250);
                                                      in_stack_fffffffffffff290 =
                                                           getFloat((char **)
                                                  in_stack_fffffffffffff240);
                                                  local_170 = &local_b44;
                                                  local_178 = &local_b48;
                                                  local_f4 = local_b48;
                                                  local_f0 = local_b48;
                                                  local_290 = local_b38;
                                                  local_298 = &local_b44;
                                                  local_108 = (element_type *)
                                                              CONCAT44(local_b48,
                                                                       in_stack_fffffffffffff290);
                                                  local_ec = 0;
                                                  p_Stack_100 = (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  (ulong)(uint)local_b48;
                                                  local_1f0 = &local_648;
                                                  in_RCX = (fd_set *)local_b38;
                                                  local_554 = 2;
                                                  local_b48 = in_stack_fffffffffffff290;
                                                  local_1f8 = in_RCX;
                                                  local_f8 = in_stack_fffffffffffff290;
                                                  local_b44 = in_stack_fffffffffffff290;
                                                  local_b40 = local_f4;
                                                  local_b3c = local_f0;
                                                  local_b38._0_8_ = local_108;
                                                  local_b38._8_8_ = p_Stack_100;
                                                  local_648 = local_108;
                                                  _Stack_640._M_pi = p_Stack_100;
                                                  }
                                                  else {
                                                    iVar3 = strncmp((char *)local_6e8._8_8_,
                                                                    "roughnessMap",0xc);
                                                    if (iVar3 == 0) {
                                                      local_6e8._8_8_ = local_6e8._8_8_ + 0xc;
                                                      parseSep(in_stack_fffffffffffff250);
                                                      FileName::FileName((FileName *)
                                                                         CONCAT44(
                                                  in_stack_fffffffffffff294,
                                                  in_stack_fffffffffffff290),
                                                  (char *)CONCAT44(in_stack_fffffffffffff28c,
                                                                   in_stack_fffffffffffff288));
                                                  loadTexture(this_00,fname);
                                                  std::shared_ptr<embree::Texture>::operator=
                                                            ((shared_ptr<embree::Texture> *)
                                                             in_stack_fffffffffffff240,
                                                             (shared_ptr<embree::Texture> *)
                                                             in_stack_fffffffffffff238);
                                                  std::shared_ptr<embree::Texture>::~shared_ptr
                                                            ((shared_ptr<embree::Texture> *)0x4a452f
                                                            );
                                                  FileName::~FileName((FileName *)0x4a453c);
                                                  local_554 = 2;
                                                  }
                                                  else {
                                                    iVar3 = strncmp((char *)local_6e8._8_8_,
                                                                    "roughness",9);
                                                    if (iVar3 == 0) {
                                                      local_6e8._8_8_ = local_6e8._8_8_ + 9;
                                                      parseSep(in_stack_fffffffffffff250);
                                                      in_stack_fffffffffffff28c =
                                                           getFloat((char **)
                                                  in_stack_fffffffffffff240);
                                                  local_698.m128[3] =
                                                       1.0 / (in_stack_fffffffffffff28c + 1e-06);
                                                  local_554 = 2;
                                                  local_5c8 = in_stack_fffffffffffff28c;
                                                  }
                                                  else {
                                                    iVar3 = strncmp((char *)local_6e8._8_8_,
                                                                    "colorMap",8);
                                                    if (iVar3 == 0) {
                                                      local_6e8._8_8_ = local_6e8._8_8_ + 8;
                                                      parseSep(in_stack_fffffffffffff250);
                                                      FileName::FileName((FileName *)
                                                                         CONCAT44(
                                                  in_stack_fffffffffffff294,
                                                  in_stack_fffffffffffff290),
                                                  (char *)CONCAT44(in_stack_fffffffffffff28c,
                                                                   in_stack_fffffffffffff288));
                                                  loadTexture(this_00,fname);
                                                  std::shared_ptr<embree::Texture>::operator=
                                                            ((shared_ptr<embree::Texture> *)
                                                             in_stack_fffffffffffff240,
                                                             (shared_ptr<embree::Texture> *)
                                                             in_stack_fffffffffffff238);
                                                  std::shared_ptr<embree::Texture>::~shared_ptr
                                                            ((shared_ptr<embree::Texture> *)0x4a46b1
                                                            );
                                                  FileName::~FileName((FileName *)0x4a46be);
                                                  local_554 = 2;
                                                  }
                                                  else {
                                                    iVar3 = strncmp((char *)local_6e8._8_8_,"color",
                                                                    5);
                                                    if (iVar3 == 0) {
                                                      local_6e8._8_8_ = local_6e8._8_8_ + 5;
                                                      parseSep(in_stack_fffffffffffff250);
                                                      getVec3f(in_stack_fffffffffffff258);
                                                      local_280 = local_bb8;
                                                      local_288 = local_bc4;
                                                      local_10c = 0;
                                                      peStack_120 = (element_type *)(ulong)local_bbc
                                                      ;
                                                      local_200 = local_668;
                                                      in_RCX = (fd_set *)local_bb8;
                                                      local_554 = 2;
                                                      local_208 = in_RCX;
                                                      local_bb8._8_8_ = peStack_120;
                                                      _Stack_660._M_pi =
                                                           (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  peStack_120;
                                                  }
                                                  else {
                                                    iVar3 = strncmp((char *)local_6e8._8_8_,
                                                                    "coat.color",10);
                                                    if (iVar3 == 0) {
                                                      local_6e8._8_8_ = local_6e8._8_8_ + 10;
                                                      parseSep(in_stack_fffffffffffff250);
                                                      getVec3f(in_stack_fffffffffffff258);
                                                      local_270 = local_c54 + 0x7c;
                                                      local_278 = local_c54 + 0x70;
                                                      local_12c = 0;
                                                      peStack_140 = (element_type *)
                                                                    (ulong)(uint)local_c54._120_4_;
                                                      local_210 = local_668;
                                                      in_RCX = (fd_set *)(local_c54 + 0x7c);
                                                      local_554 = 2;
                                                      local_218 = in_RCX;
                                                      peStack_bd0 = peStack_140;
                                                      _Stack_660._M_pi =
                                                           (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  peStack_140;
                                                  }
                                                  else {
                                                    iVar3 = strncmp((char *)local_6e8._8_8_,
                                                                    "coat.eta",8);
                                                    if (iVar3 == 0) {
                                                      local_6e8._8_8_ = local_6e8._8_8_ + 8;
                                                      parseSep(in_stack_fffffffffffff250);
                                                      in_stack_fffffffffffff288 =
                                                           getFloat((char **)
                                                  in_stack_fffffffffffff240);
                                                  local_554 = 2;
                                                  local_5b0 = in_stack_fffffffffffff288;
                                                  }
                                                  else {
                                                    iVar3 = strncmp((char *)local_6e8._8_8_,
                                                                    "coat.roughnessMap",0x11);
                                                    if (iVar3 == 0) {
                                                      local_6e8._8_8_ = local_6e8._8_8_ + 0x11;
                                                      parseSep(in_stack_fffffffffffff250);
                                                      FileName::FileName((FileName *)
                                                                         CONCAT44(
                                                  in_stack_fffffffffffff294,
                                                  in_stack_fffffffffffff290),
                                                  (char *)CONCAT44(in_stack_fffffffffffff28c,
                                                                   in_stack_fffffffffffff288));
                                                  loadTexture(this_00,fname);
                                                  std::shared_ptr<embree::Texture>::operator=
                                                            ((shared_ptr<embree::Texture> *)
                                                             in_stack_fffffffffffff240,
                                                             (shared_ptr<embree::Texture> *)
                                                             in_stack_fffffffffffff238);
                                                  std::shared_ptr<embree::Texture>::~shared_ptr
                                                            ((shared_ptr<embree::Texture> *)0x4a4aa3
                                                            );
                                                  FileName::~FileName((FileName *)0x4a4ab0);
                                                  local_554 = 2;
                                                  }
                                                  else {
                                                    iVar3 = strncmp((char *)local_6e8._8_8_,
                                                                    "coat.roughness",0xe);
                                                    if (iVar3 == 0) {
                                                      local_6e8._8_8_ = local_6e8._8_8_ + 0xe;
                                                      parseSep(in_stack_fffffffffffff250);
                                                      in_stack_fffffffffffff284 =
                                                           getFloat((char **)
                                                  in_stack_fffffffffffff240);
                                                  local_554 = 2;
                                                  local_5ac = in_stack_fffffffffffff284;
                                                  }
                                                  else {
                                                    iVar3 = strncmp((char *)local_6e8._8_8_,
                                                                    "bumpMap",7);
                                                    if (iVar3 == 0) {
                                                      local_6e8._8_8_ = local_6e8._8_8_ + 7;
                                                      parseSep(in_stack_fffffffffffff250);
                                                      FileName::FileName((FileName *)
                                                                         CONCAT44(
                                                  in_stack_fffffffffffff294,
                                                  in_stack_fffffffffffff290),
                                                  (char *)CONCAT44(in_stack_fffffffffffff28c,
                                                                   in_stack_fffffffffffff288));
                                                  loadTexture(this_00,fname);
                                                  std::shared_ptr<embree::Texture>::operator=
                                                            ((shared_ptr<embree::Texture> *)
                                                             in_stack_fffffffffffff240,
                                                             (shared_ptr<embree::Texture> *)
                                                             in_stack_fffffffffffff238);
                                                  std::shared_ptr<embree::Texture>::~shared_ptr
                                                            ((shared_ptr<embree::Texture> *)0x4a4bff
                                                            );
                                                  FileName::~FileName((FileName *)0x4a4c0c);
                                                  local_554 = 2;
                                                  }
                                                  else {
                                                    iVar3 = strncmp((char *)local_6e8._8_8_,"bump",4
                                                                   );
                                                    if (iVar3 == 0) {
                                                      local_6e8._8_8_ = local_6e8._8_8_ + 4;
                                                      parseSep(in_stack_fffffffffffff250);
                                                      local_598 = getFloat((char **)
                                                  in_stack_fffffffffffff240);
                                                  local_554 = 2;
                                                  }
                                                  else {
                                                    iVar3 = strncmp((char *)local_6e8._8_8_,"eta",3)
                                                    ;
                                                    if (iVar3 == 0) {
                                                      local_6e8._8_8_ = local_6e8._8_8_ + 3;
                                                      parseSep(in_stack_fffffffffffff250);
                                                      getVec3f(in_stack_fffffffffffff258);
                                                      local_150 = local_594;
                                                      in_RCX = (fd_set *)local_c54;
                                                      local_554 = 2;
                                                      local_158 = in_RCX;
                                                    }
                                                    else {
                                                      iVar3 = strncmp((char *)local_6e8._8_8_,"k",1)
                                                      ;
                                                      if (iVar3 == 0) {
                                                        local_6e8._8_8_ = local_6e8._8_8_ + 1;
                                                        parseSep(in_stack_fffffffffffff250);
                                                        getVec3f(in_stack_fffffffffffff258);
                                                        local_160 = local_588;
                                                        in_RCX = (fd_set *)(local_c70 + 0x10);
                                                        local_554 = 2;
                                                        local_168 = in_RCX;
                                                      }
                                                      else {
                                                        local_554 = 0;
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&local_6b8);
    }
    bVar10 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff240,(char *)in_stack_fffffffffffff238);
    if (bVar10) {
      ExtObjMaterial::select
                ((ExtObjMaterial *)local_c70,(int)&local_698,__readfds_00,in_RCX,in_R8,in_R9);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
                            (key_type *)in_stack_fffffffffffff278);
      local_248 = (undefined8 *)local_c70;
      local_240 = pmVar9;
      if (pmVar9->ptr != (MaterialNode *)0x0) {
        (*(pmVar9->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      pmVar9->ptr = (MaterialNode *)*local_248;
      *local_248 = 0;
      local_258 = local_c70;
      if ((long *)local_c70._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_c70._0_8_ + 0x18))();
      }
      local_228 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
                               (key_type *)in_stack_fffffffffffff278);
      in_stack_fffffffffffff240 = (ExtObjMaterial *)local_228->ptr;
      std::__cxx11::string::operator=((string *)&in_stack_fffffffffffff240->Kd,local_578);
    }
    std::ifstream::close();
    ExtObjMaterial::~ExtObjMaterial(in_stack_fffffffffffff240);
    std::__cxx11::string::~string(local_578);
    local_554 = 0;
  }
  std::ifstream::~ifstream(local_520);
  return;
}

Assistant:

void OBJLoader::loadMTL(const FileName &fileName)
  {
    std::ifstream cin;
    cin.open(fileName.c_str());
    if (!cin.is_open()) {
      std::cerr << "cannot open " << fileName.str() << std::endl;
      return;
    }

    std::string name;
    ExtObjMaterial cur;

    while (cin.peek() != -1)
    {
      /* load next multiline */
      std::string line; std::getline(cin,line);
      while (!line.empty() && line[line.size()-1] == '\\') {
	line[line.size()-1] = ' ';
	std::string next_line; std::getline(cin,next_line);
	if (next_line.empty()) break;
	line += next_line;
      }
      const char* token = trimEnd(line.c_str() + strspn(line.c_str(), " \t"));

      if (token[0] == 0  ) continue; // ignore empty lines
      if (token[0] == '#') continue; // ignore comments

      if (!strncmp(token, "newmtl", 6)) 
      {
        if (name != "") {
          material[name] = cur.select();
          material[name]->name = name;
        }
        
        parseSep(token+=6);
        name = token;
        cur = ExtObjMaterial();
        continue;
      }
      if (name == "") THROW_RUNTIME_ERROR("invalid material file: newmtl expected first");
      
      try 
      {
        if (!strncmp(token, "illum", 5)) { parseSep(token += 5);  continue; }
        
        if (!strncmp(token, "d",  1)) { parseSep(token += 1);  cur.d  = getFloat(token); continue; }
        if (!strncmp(token, "Ns", 2)) { parseSep(token += 2);  cur.Ns = getFloat(token); continue; }
        if (!strncmp(token, "Ni", 2)) { parseSep(token += 2);  cur.Ni = getFloat(token); continue; }
        
        if (!strncmp(token, "map_d", 5) || !strncmp(token, "d_map", 5)) {
          parseSep(token += 5);
          cur.map_d = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Ka", 6) || !strncmp(token, "Ka_map", 6)) {
          parseSep(token += 6);
          cur.map_Ka = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Kd", 6) || !strncmp(token, "Kd_map", 6)) {
          parseSep(token += 6);
          cur.map_Kd = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Ks", 6) || !strncmp(token, "Ks_map", 6)) {
          parseSep(token += 6);
          cur.map_Ks = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Kt", 6) || !strncmp(token, "Kt_map", 6)) {
          parseSep(token += 6);
          cur.map_Kt = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Tf", 6) || !strncmp(token, "Tf_map", 6)) {
          parseSep(token += 6);
          cur.map_Kt = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Ns", 6) || !strncmp(token, "Ns_map", 6)) {
          parseSep(token += 6);
          cur.map_Ns = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Displ", 9) || !strncmp(token, "Displ_map", 9)) {
          parseSep(token += 9);
          cur.map_Displ = loadTexture(FileName(token));
          continue;
        }
        
        if (!strncmp(token, "Ka", 2)) { parseSep(token += 2);  cur.Ka = getVec3f(token); continue; }
        if (!strncmp(token, "Kd", 2)) { parseSep(token += 2);  cur.Kd = getVec3f(token); continue; }
        if (!strncmp(token, "Ks", 2)) { parseSep(token += 2);  cur.Ks = getVec3f(token); continue; }
        if (!strncmp(token, "Kt", 2)) { parseSep(token += 2);  cur.Kt = getVec3f(token); continue; }
        if (!strncmp(token, "Tf", 2)) { parseSep(token += 2);  cur.Kt = getVec3f(token); continue; }
        
        /* extended OBJ */
        if (!strncmp(token, "type", 4)) {
          parseSep(token += 4); std::string type = token;
          if      (type == "matte") cur.type = ExtObjMaterial::MATTE;
          else if (type == "glass") cur.type = ExtObjMaterial::GLASS;
          else if (type == "metal") cur.type = ExtObjMaterial::METAL;
          else if (type == "metallicPaint") cur.type = ExtObjMaterial::METALLIC_PAINT;
          else if (type == "principled") cur.type = ExtObjMaterial::NONE;
          else if (type == "luminous") cur.type = ExtObjMaterial::NONE;
          continue;
        }

        /* OSPRay principled material extensions */
        if (!strncmp(token, "baseColor",         9)) { parseSep(token +=  9); cur.Kd  = getVec3f(token); continue; }
        if (!strncmp(token, "ior",               3)) { parseSep(token +=  3); cur.Ni = getFloat(token); continue; }
        if (!strncmp(token, "map_baseColor",    13)) { parseSep(token += 13); cur.map_Kd = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "map_specular",     12)) { parseSep(token += 12); cur.map_Ks = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "map_normal.scale", 16)) { parseSep(token += 16); continue; }
        if (!strncmp(token, "map_normal",       10)) { parseSep(token += 10); cur.map_Displ = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "transmissionColor",17)) { parseSep(token += 17); cur.Kt = getVec3f(token); continue; }
        if (!strncmp(token, "transmission",     12)) { parseSep(token += 12); cur.Kt = Vec3f(getFloat(token)); continue; }
                
        if (!strncmp(token, "roughnessMap",     12)) { parseSep(token += 12); cur.roughnessMap = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "roughness",         9)) { parseSep(token +=  9); cur.roughness = getFloat(token); cur.Ns = 1.0f/(cur.roughness+1E-6f); continue; }
        if (!strncmp(token, "colorMap",          8)) { parseSep(token +=  8); cur.map_Kd  = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "color",             5)) { parseSep(token +=  5); cur.Kd      = getVec3f(token); continue; }
        if (!strncmp(token, "coat.color",       10)) { parseSep(token += 10); cur.Kd      = getVec3f(token); continue; }
        if (!strncmp(token, "coat.eta",          8)) { parseSep(token +=  8); cur.coat_eta  = getFloat(token); continue; }
        if (!strncmp(token, "coat.roughnessMap",17)) { parseSep(token += 17); cur.coat_roughnessMap   = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "coat.roughness",   14)) { parseSep(token += 14); cur.coat_roughness = getFloat(token); continue; }
        if (!strncmp(token, "bumpMap",           7)) { parseSep(token +=  7); cur.map_Displ = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "bump",              4)) { parseSep(token +=  4); cur.bump   = getFloat(token); continue; }
        if (!strncmp(token, "eta",               3)) { parseSep(token +=  3); cur.eta = getVec3f(token); continue; }
        if (!strncmp(token, "k",                 1)) { parseSep(token +=  1); cur.k = getVec3f(token); continue; }
      } 
      catch (const std::runtime_error& e) {
        std::cerr << "Error: " << e.what() << std::endl;
      }
    }

    if (name != "") {
      material[name] = cur.select();
      material[name]->name = name;
    }

    cin.close();
  }